

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>
  *pEVar5;
  node_ptr plVar6;
  node_ptr plVar7;
  Row_container *pRVar8;
  undefined8 uVar9;
  Index IVar10;
  pointer ppEVar11;
  pointer ppEVar12;
  bool bVar13;
  node_ptr next;
  _Rb_tree_node_base *p_Var14;
  pointer ppEVar15;
  undefined4 local_2b4;
  undefined *local_2b0;
  undefined4 *local_2a8;
  undefined **local_2a0;
  undefined **local_298;
  ulong local_290;
  shared_count sStack_288;
  undefined4 **local_280;
  char *local_278;
  char *local_270;
  shared_count sStack_268;
  undefined **local_260;
  undefined1 local_258;
  undefined8 *local_250;
  undefined ***local_248;
  undefined4 **local_240;
  char *local_238;
  undefined **local_230;
  char *local_228;
  shared_count sStack_220;
  char *local_218;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
  col;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
  moveCol;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
  ::
  Naive_vector_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
              *)&col,(matrix->
                     super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  uVar9._4_4_ = moveCol._28_4_;
  uVar9._0_4_ = moveCol.super_Chain_column_option.pairedColumn_;
  p_Var14 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  IVar10 = col.super_Row_access_option.columnIndex_;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while ((_Rb_tree_header *)p_Var14 != p_Var1) {
    col.super_Row_access_option.columnIndex_ = IVar10;
    col.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         moveCol.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    col.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         moveCol.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    col.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         moveCol.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    moveCol._24_8_ = uVar9;
    if (p_Var14[1]._M_parent != (_Base_ptr)&p_Var14[1]._M_parent &&
        p_Var14[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var14[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d);
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001de440;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = (undefined4 **)0x1a9184;
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2a8 = (undefined4 *)CONCAT44(local_2a8._4_4_,iVar3);
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,6);
        local_230 = (undefined **)CONCAT71(local_230._1_7_,iVar3 == 6);
        local_228 = (char *)0x0;
        sStack_220.pi_ = (sp_counted_base *)0x0;
        local_278 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_270 = "";
        local_240 = &local_2a8;
        moveCol.super_Row_access_option.rows_ =
             (Row_container *)((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
        moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_001de900;
        moveCol.super_Column_dimension_option.dim_ = 0x1e6118;
        moveCol.super_Chain_column_option.pivot_ = 0;
        moveCol._24_8_ = &local_240;
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001de940;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_230,&local_298,&local_278,0x20d,1,2,2,"entry.get_column_index()",&moveCol,
                   "6",&local_260);
        boost::detail::shared_count::~shared_count(&sStack_220);
      }
    }
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    IVar10 = col.super_Row_access_option.columnIndex_;
    moveCol.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         col.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    moveCol.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         col.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    moveCol.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         col.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar9 = moveCol._24_8_;
  }
  col.super_Row_access_option.columnIndex_ = 0;
  moveCol.super_Row_access_option.columnIndex_ = IVar10;
  moveCol.super_Row_access_option.rows_ =
       (Row_container *)
       CONCAT44(col.super_Row_access_option.rows_._4_4_,col.super_Row_access_option.rows_._0_4_);
  col.super_Column_dimension_option.dim_ = -1;
  col.super_Chain_column_option.pivot_ = 0xffffffff;
  col.super_Chain_column_option.pairedColumn_ = 0xffffffff;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  col.operators_ = (Field_operators *)0x0;
  col.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b0 = (undefined *)
              ((long)moveCol.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)moveCol.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_2a0 = &local_2b0;
  local_2a8 = &local_2b4;
  local_2b4 = 4;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_248 = &local_2a0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278._0_1_ =
       (long)moveCol.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)moveCol.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x20;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_2b0 = (undefined *)
              ((long)col.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)col.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_278 = (char *)CONCAT71(local_278._1_7_,
                               col.column_.
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish ==
                               col.column_.
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  local_2b4 = 0;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_230,&local_240,0x21d,1,2,2,"col.size()",&local_260,"0",&local_298);
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar13 = Gudhi::persistence_matrix::operator==
                     ((matrix->
                      super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&moveCol);
  local_298 = (undefined **)CONCAT71(local_298._1_7_,bVar13);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_230 = (undefined **)0x1b3d2a;
  local_228 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de388;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_248 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  p_Var14 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  IVar10 = col.super_Row_access_option.columnIndex_;
  while ((_Rb_tree_header *)p_Var14 != p_Var1) {
    col.super_Row_access_option.columnIndex_ = IVar10;
    if (p_Var14[1]._M_parent != (_Base_ptr)&p_Var14[1]._M_parent &&
        p_Var14[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var14[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                   &local_150);
        local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
        local_230 = &PTR__lazy_ostream_001de440;
        sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_218 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar3);
        local_2b4 = 6;
        local_278 = (char *)CONCAT71(local_278._1_7_,iVar3 == 6);
        local_270 = (char *)0x0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_240 = (undefined4 **)0x1a9c54;
        local_238 = "";
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001de900;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        local_2a8 = &local_2b4;
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001de940;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_278,&local_230,&local_240,0x225,1,2,2,"entry.get_column_index()",
                   &local_260,"6",&local_298);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
    }
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    IVar10 = col.super_Row_access_option.columnIndex_;
  }
  pRVar8 = (Row_container *)
           CONCAT44(col.super_Row_access_option.rows_._4_4_,col.super_Row_access_option.rows_._0_4_)
  ;
  moveCol.super_Row_access_option.rows_._4_4_ =
       (undefined4)((ulong)moveCol.super_Row_access_option.rows_ >> 0x20);
  col.super_Row_access_option.rows_._0_4_ = moveCol.super_Row_access_option.rows_._0_4_;
  col.super_Row_access_option.rows_._4_4_ = moveCol.super_Row_access_option.rows_._4_4_;
  col.super_Row_access_option.columnIndex_ = moveCol.super_Row_access_option.columnIndex_;
  moveCol.super_Row_access_option.columnIndex_ = IVar10;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  ppEVar15 = moveCol.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar11 = moveCol.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar12 = moveCol.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  moveCol.super_Row_access_option.rows_ = pRVar8;
  moveCol.super_Column_dimension_option.dim_ = col.super_Column_dimension_option.dim_;
  moveCol.super_Chain_column_option.pivot_ = col.super_Chain_column_option.pivot_;
  moveCol.super_Chain_column_option.pairedColumn_ = col.super_Chain_column_option.pairedColumn_;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  moveCol.operators_ = col.operators_;
  moveCol.entryPool_ = col.entryPool_;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar12;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppEVar11;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppEVar15;
  local_2b0 = (undefined *)
              ((long)moveCol.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)moveCol.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b4 = 0;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  local_278._0_1_ =
       moveCol.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       moveCol.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b0 = (undefined *)
              ((long)col.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)col.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_278 = (char *)CONCAT71(local_278._1_7_,
                               (long)col.column_.
                                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)col.column_.
                                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start == 0x20);
  local_2b4 = 4;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_230,&local_240,0x235,1,2,2,"col.size()",&local_260,"4",&local_298);
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar13 = Gudhi::persistence_matrix::operator==
                     ((matrix->
                      super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&col);
  local_298 = (undefined **)CONCAT71(local_298._1_7_,bVar13);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_230 = (undefined **)0x1b3d3f;
  local_228 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de388;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_248 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  p_Var14 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  ppEVar15 = moveCol.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar11 = moveCol.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while (moveCol.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start = ppEVar15,
        moveCol.column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppEVar11, (_Rb_tree_header *)p_Var14 != p_Var1)
  {
    if (p_Var14[1]._M_parent != (_Base_ptr)&p_Var14[1]._M_parent &&
        p_Var14[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var14[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                   &local_170);
        local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
        local_230 = &PTR__lazy_ostream_001de440;
        sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_218 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar3);
        local_2b4 = 6;
        local_278 = (char *)CONCAT71(local_278._1_7_,iVar3 == 6);
        local_270 = (char *)0x0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_240 = (undefined4 **)0x1a9c54;
        local_238 = "";
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001de900;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        local_2a8 = &local_2b4;
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001de940;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_278,&local_230,&local_240,0x23d,1,2,2,"entry.get_column_index()",
                   &local_260,"6",&local_298);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
    }
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    ppEVar15 = moveCol.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar11 = moveCol.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppEVar15 != ppEVar11; ppEVar15 = ppEVar15 + 1) {
    pEVar5 = *ppEVar15;
    if ((moveCol.super_Row_access_option.rows_ != (Row_container *)0x0) &&
       (plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
       plVar6 != (node_ptr)0x0)) {
      plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar7->next_ = plVar6;
      plVar6->prev_ = plVar7;
      (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
      (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    }
    if (pEVar5 != (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>
                   *)0x0) {
      plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_;
      if (plVar6 != (node_ptr)0x0) {
        plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
        plVar7->next_ = plVar6;
        plVar6->prev_ = plVar7;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
        ;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
        ;
      }
      operator_delete(pEVar5,0x20);
    }
  }
  ppEVar15 = col.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (moveCol.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(moveCol.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)moveCol.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)moveCol.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ppEVar15 = col.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; ppEVar15 !=
         col.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish; ppEVar15 = ppEVar15 + 1) {
    pEVar5 = *ppEVar15;
    if ((CONCAT44(col.super_Row_access_option.rows_._4_4_,col.super_Row_access_option.rows_._0_4_)
         != 0) &&
       (plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
       plVar6 != (node_ptr)0x0)) {
      plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar7->next_ = plVar6;
      plVar6->prev_ = plVar7;
      (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
      (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    }
    if (pEVar5 != (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>
                   *)0x0) {
      plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_;
      if (plVar6 != (node_ptr)0x0) {
        plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
        plVar7->next_ = plVar6;
        plVar6->prev_ = plVar7;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
        ;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
        ;
      }
      operator_delete(pEVar5,0x20);
    }
  }
  if (col.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(col.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)col.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)col.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}